

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mad.cpp
# Opt level: O2

void duckdb::MedianAbsoluteDeviationOperation<float>::
     Window<duckdb::QuantileState<float,duckdb::QuantileStandardType>,float,float>
               (AggregateInputData *aggr_input_data,WindowPartitionInput *partition,
               const_data_ptr_t g_state,data_ptr_t l_state,SubFrames *frames,Vector *result,
               idx_t ridx)

{
  idx_t iVar1;
  idx_t *index;
  double dVar2;
  bool bVar3;
  CursorType *data;
  idx_t n;
  FunctionData *pFVar4;
  reference q;
  WindowQuantileState<float> *this;
  type this_00;
  const_reference pvVar5;
  long lVar6;
  float fVar7;
  undefined1 auVar8 [16];
  QuantileIncluded<float> included;
  MAD mad;
  ID indirect;
  MadIndirect mad_indirect;
  Interpolator<false> interp;
  float local_bc;
  Vector *local_b8;
  data_ptr_t local_b0;
  QuantileIncluded<float> local_a8;
  double local_98;
  double dStack_90;
  MadAccessor<float,_float,_float> local_80;
  QuantileIndirect<float> local_78;
  QuantileComposed<duckdb::MadAccessor<float,_float,_float>,_duckdb::QuantileIndirect<float>_>
  local_70;
  Interpolator<false> local_60;
  
  data = QuantileState<float,_duckdb::QuantileStandardType>::GetOrCreateWindowCursor
                   ((QuantileState<float,_duckdb::QuantileStandardType> *)l_state,partition);
  local_a8.fmask = partition->filter_mask;
  local_b0 = result->data;
  local_a8.dmask = data;
  n = QuantileOperation::FrameSize<float>(&local_a8,frames);
  if (n != 0) {
    pFVar4 = optional_ptr<duckdb::FunctionData,_true>::operator->(&aggr_input_data->bind_data);
    q = vector<duckdb::QuantileValue,_true>::get<true>
                  ((vector<duckdb::QuantileValue,_true> *)(pFVar4 + 1),0);
    this = QuantileState<float,_duckdb::QuantileStandardType>::GetOrCreateWindowState
                     ((QuantileState<float,_duckdb::QuantileStandardType> *)l_state);
    if ((g_state == (const_data_ptr_t)0x0) ||
       (bVar3 = QuantileState<float,_duckdb::QuantileStandardType>::HasTree
                          ((QuantileState<float,_duckdb::QuantileStandardType> *)g_state), !bVar3))
    {
      WindowQuantileState<float>::UpdateSkip(this,data,frames,&local_a8);
      this_00 = this;
    }
    else {
      this_00 = unique_ptr<duckdb::WindowQuantileState<float>,_std::default_delete<duckdb::WindowQuantileState<float>_>,_true>
                ::operator*((unique_ptr<duckdb::WindowQuantileState<float>,_std::default_delete<duckdb::WindowQuantileState<float>_>,_true>
                             *)(g_state + 0x18));
    }
    local_bc = WindowQuantileState<float>::WindowScalar<float,false>(this_00,data,frames,n,result,q)
    ;
    pvVar5 = vector<duckdb::FrameBounds,_true>::back(frames);
    iVar1 = pvVar5->end;
    pvVar5 = vector<duckdb::FrameBounds,_true>::front(frames);
    WindowQuantileState<float>::SetCount(this,iVar1 - pvVar5->start);
    index = (this->m).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
    local_b8 = result;
    ReuseIndexes(index,frames,&this->prevs);
    ::std::__partition<unsigned_long*,duckdb::QuantileIncluded<float>>
              (index,index + this->count,local_a8.fmask,local_a8.dmask);
    local_60.desc = false;
    lVar6 = n - 1;
    auVar8._8_4_ = (int)((ulong)lVar6 >> 0x20);
    auVar8._0_8_ = lVar6;
    auVar8._12_4_ = 0x45300000;
    dStack_90 = auVar8._8_8_ - 1.9342813113834067e+25;
    local_98 = (dStack_90 + ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) * q->dbl
    ;
    local_60.RN = local_98;
    dVar2 = floor(local_98);
    local_60.FRN = (long)(dVar2 - 9.223372036854776e+18) & (long)dVar2 >> 0x3f | (long)dVar2;
    dVar2 = ceil(local_98);
    local_60.CRN = (long)(dVar2 - 9.223372036854776e+18) & (long)dVar2 >> 0x3f | (long)dVar2;
    local_60.begin = 0;
    local_70.inner = &local_78;
    local_70.outer = &local_80;
    local_80.median = &local_bc;
    local_78.data = data;
    local_60.end = n;
    fVar7 = Interpolator<false>::
            Operation<unsigned_long,float,duckdb::QuantileComposed<duckdb::MadAccessor<float,float,float>,duckdb::QuantileIndirect<float>>>
                      (&local_60,index,local_b8,&local_70);
    *(float *)(local_b0 + ridx * 4) = fVar7;
    ::std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>::operator=
              (&(this->prevs).
                super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>,
               &frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>);
    return;
  }
  FlatVector::VerifyFlatVector(result);
  TemplatedValidityMask<unsigned_long>::SetInvalid
            (&(result->validity).super_TemplatedValidityMask<unsigned_long>,ridx);
  return;
}

Assistant:

static void Window(AggregateInputData &aggr_input_data, const WindowPartitionInput &partition,
	                   const_data_ptr_t g_state, data_ptr_t l_state, const SubFrames &frames, Vector &result,
	                   idx_t ridx) {
		auto &state = *reinterpret_cast<STATE *>(l_state);
		auto gstate = reinterpret_cast<const STATE *>(g_state);

		auto &data = state.GetOrCreateWindowCursor(partition);
		const auto &fmask = partition.filter_mask;

		auto rdata = FlatVector::GetData<RESULT_TYPE>(result);

		QuantileIncluded<INPUT_TYPE> included(fmask, data);
		const auto n = FrameSize(included, frames);

		if (!n) {
			auto &rmask = FlatVector::Validity(result);
			rmask.Set(ridx, false);
			return;
		}

		//	Compute the median
		D_ASSERT(aggr_input_data.bind_data);
		auto &bind_data = aggr_input_data.bind_data->Cast<QuantileBindData>();

		D_ASSERT(bind_data.quantiles.size() == 1);
		const auto &quantile = bind_data.quantiles[0];
		auto &window_state = state.GetOrCreateWindowState();
		MEDIAN_TYPE med;
		if (gstate && gstate->HasTree()) {
			med = gstate->GetWindowState().template WindowScalar<MEDIAN_TYPE, false>(data, frames, n, result, quantile);
		} else {
			window_state.UpdateSkip(data, frames, included);
			med = window_state.template WindowScalar<MEDIAN_TYPE, false>(data, frames, n, result, quantile);
		}

		//  Lazily initialise frame state
		window_state.SetCount(frames.back().end - frames.front().start);
		auto index2 = window_state.m.data();
		D_ASSERT(index2);

		// The replacement trick does not work on the second index because if
		// the median has changed, the previous order is not correct.
		// It is probably close, however, and so reuse is helpful.
		auto &prevs = window_state.prevs;
		ReuseIndexes(index2, frames, prevs);
		std::partition(index2, index2 + window_state.count, included);

		Interpolator<false> interp(quantile, n, false);

		// Compute mad from the second index
		using ID = QuantileIndirect<INPUT_TYPE>;
		ID indirect(data);

		using MAD = MadAccessor<INPUT_TYPE, RESULT_TYPE, MEDIAN_TYPE>;
		MAD mad(med);

		using MadIndirect = QuantileComposed<MAD, ID>;
		MadIndirect mad_indirect(mad, indirect);
		rdata[ridx] = interp.template Operation<idx_t, RESULT_TYPE, MadIndirect>(index2, result, mad_indirect);

		//	Prev is used by both skip lists and increments
		prevs = frames;
	}